

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp.c
# Opt level: O3

void lejp_check_path_match(lejp_ctx *ctx)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  char **ppcVar4;
  size_t sVar5;
  char *pcVar6;
  char cVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  byte bVar12;
  byte bVar13;
  
  sVar5 = 8;
  if (ctx->path_stride != 0) {
    sVar5 = ctx->path_stride;
  }
  if (ctx->path_match == '\0') {
    bVar2 = ctx->pst_sp;
    uVar8 = (ulong)ctx->pst[bVar2].count_paths;
    ctx->wildcount = '\0';
    if (uVar8 != 0) {
      pcVar1 = ctx->path;
      ppcVar4 = ctx->pst[bVar2].paths;
      uVar9 = 0;
      while( true ) {
        pcVar11 = *(char **)((long)ppcVar4 + sVar5 * uVar9);
        cVar7 = *pcVar1;
        if (cVar7 != '\0') break;
LAB_0013aa3a:
        if (*pcVar11 == '\0') {
          ctx->path_match = (char)uVar9 + '\x01';
          ctx->path_match_len = ctx->pst[bVar2].ppos;
          return;
        }
LAB_0013aa40:
        uVar9 = uVar9 + 1;
        ctx->wildcount = '\0';
        if (uVar9 == uVar8) {
          return;
        }
      }
      pcVar6 = pcVar1;
      pcVar10 = pcVar11;
      bVar12 = 0;
LAB_0013a9d6:
      cVar3 = *pcVar10;
      if (cVar3 == '*') {
        bVar13 = bVar12 + 1;
        ctx->wildcount = bVar13;
        ctx->wild[bVar12] = (short)pcVar6 - (short)pcVar1;
        pcVar11 = pcVar10 + 1;
        do {
          if (*pcVar6 == '.') {
            if (*pcVar11 != '\0') goto LAB_0013aa2f;
          }
          else if (*pcVar6 == '\0') goto LAB_0013aa3a;
          pcVar6 = pcVar6 + 1;
        } while( true );
      }
      if ((cVar3 != '\0') && (cVar7 == cVar3)) {
        cVar7 = pcVar6[1];
        pcVar6 = pcVar6 + 1;
        bVar13 = bVar12;
        goto LAB_0013aa35;
      }
      goto LAB_0013aa40;
    }
  }
  return;
LAB_0013aa2f:
  cVar7 = '.';
LAB_0013aa35:
  pcVar11 = pcVar10 + 1;
  pcVar10 = pcVar11;
  bVar12 = bVar13;
  if (cVar7 == '\0') goto LAB_0013aa3a;
  goto LAB_0013a9d6;
}

Assistant:

void
lejp_check_path_match(struct lejp_ctx *ctx)
{
	const char *p, *q;
	int n;
	size_t s = sizeof(char *);

	if (ctx->path_stride)
		s = ctx->path_stride;

	/* we only need to check if a match is not active */
	for (n = 0; !ctx->path_match &&
	     n < ctx->pst[ctx->pst_sp].count_paths; n++) {
		ctx->wildcount = 0;
		p = ctx->path;

		q = *((char **)(((char *)ctx->pst[ctx->pst_sp].paths) + (n * s)));

		while (*p && *q) {
			if (*q != '*') {
				if (*p != *q)
					break;
				p++;
				q++;
				continue;
			}
			ctx->wild[ctx->wildcount++] = lws_ptr_diff(p, ctx->path);
			q++;
			/*
			 * if * has something after it, match to .
			 * if ends with *, eat everything.
			 * This implies match sequences must be ordered like
			 *  x.*.*
			 *  x.*
			 * if both options are possible
			 */
			while (*p && (*p != '.' || !*q))
				p++;
		}
		if (*p || *q)
			continue;

		ctx->path_match = n + 1;
		ctx->path_match_len = ctx->pst[ctx->pst_sp].ppos;
		return;
	}

	if (!ctx->path_match)
		ctx->wildcount = 0;
}